

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O2

bool wabt::IsValidUtf8(char *s,size_t s_length)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)(s + s_length);
  do {
    if ((pbVar1 <= s) ||
       (pbVar1 < (byte *)s + *(int *)((anonymous_namespace)::s_utf8_length + (ulong)(byte)*s * 4)))
    goto switchD_00da0bfc_caseD_0;
    switch(*(int *)((anonymous_namespace)::s_utf8_length + (ulong)(byte)*s * 4)) {
    case 1:
      s = (char *)((byte *)s + 1);
      break;
    case 2:
    case 0:
switchD_00da0bfc_caseD_0:
      return pbVar1 <= s;
    case 3:
      goto switchD_00da0bfc_caseD_0;
    case 4:
      goto switchD_00da0bfc_caseD_0;
    }
  } while( true );
}

Assistant:

bool IsValidUtf8(const char* s, size_t s_length) {
  const uint8_t* p = reinterpret_cast<const uint8_t*>(s);
  const uint8_t* end = p + s_length;
  while (p < end) {
    uint8_t cu0 = *p;
    int length = s_utf8_length[cu0];
    if (p + length > end) {
      return false;
    }

    switch (length) {
      case 0:
        return false;

      case 1:
        p++;
        break;

      case 2:
        p++;
        if (!IsCont(*p++)) {
          return false;
        }
        break;

      case 3: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2)) ||
            (cu0 == 0xe0 && cu1 < 0xa0) ||  // Overlong encoding.
            (cu0 == 0xed && cu1 >= 0xa0))   // UTF-16 surrogate halves.
          return false;
        break;
      }

      case 4: {
        p++;
        uint8_t cu1 = *p++;
        uint8_t cu2 = *p++;
        uint8_t cu3 = *p++;
        if (!(IsCont(cu1) && IsCont(cu2) && IsCont(cu3)) ||
            (cu0 == 0xf0 && cu1 < 0x90) ||  // Overlong encoding.
            (cu0 == 0xf4 && cu1 >= 0x90))   // Code point >= 0x11000.
          return false;
        break;
      }
    }
  }
  return true;
}